

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<float>::MultAdd
          (TPZMatrix<float> *this,TPZFMatrix<float> *x,TPZFMatrix<float> *y,TPZFMatrix<float> *z,
          float alpha,float beta,int opt)

{
  float fVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZFMatrix<float> *pTVar4;
  TPZMatrix<float> *this_00;
  float *pfVar5;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float val;
  int64_t r;
  int64_t c;
  int64_t ic;
  int64_t xcols;
  int64_t cols;
  int64_t rows;
  char *in_stack_00000158;
  char *in_stack_00000160;
  int64_t in_stack_ffffffffffffff70;
  TPZFMatrix<float> *in_stack_ffffffffffffff80;
  float local_68;
  float local_64;
  long local_60;
  undefined8 in_stack_ffffffffffffffa8;
  long lVar6;
  TPZFMatrix<float> *in_stack_ffffffffffffffb0;
  long lVar7;
  
  if (in_R8D == 0) {
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    iVar3 = TPZBaseMatrix::Rows(in_RSI);
    if (iVar2 == iVar3) goto LAB_012f815b;
LAB_012f8184:
    Error(in_stack_00000160,in_stack_00000158);
  }
  else {
LAB_012f815b:
    in_stack_ffffffffffffff80 = (TPZFMatrix<float> *)TPZBaseMatrix::Rows(in_RDI);
    pTVar4 = (TPZFMatrix<float> *)TPZBaseMatrix::Rows(in_RSI);
    if (in_stack_ffffffffffffff80 != pTVar4) goto LAB_012f8184;
  }
  iVar2 = TPZBaseMatrix::Cols(in_RSI);
  iVar3 = TPZBaseMatrix::Cols(in_RDX);
  if (iVar2 == iVar3) {
    in_stack_ffffffffffffff70 = TPZBaseMatrix::Rows(in_RSI);
    iVar3 = TPZBaseMatrix::Rows(in_RDX);
    if (in_stack_ffffffffffffff70 == iVar3) goto LAB_012f81fc;
  }
  Error(in_stack_00000160,in_stack_00000158);
LAB_012f81fc:
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  this_00 = (TPZMatrix<float> *)TPZBaseMatrix::Cols(in_RDI);
  pTVar4 = (TPZFMatrix<float> *)TPZBaseMatrix::Cols(in_RSI);
  PrepareZ(this_00,pTVar4,in_stack_ffffffffffffffb0,
           (float)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8);
  local_64 = 0.0;
  for (lVar7 = 0; lVar7 < (long)pTVar4; lVar7 = lVar7 + 1) {
    if (in_R8D == 0) {
      for (lVar6 = 0; lVar6 < (long)this_00; lVar6 = lVar6 + 1) {
        for (local_60 = 0; local_60 < iVar3; local_60 = local_60 + 1) {
          pfVar5 = TPZFMatrix<float>::operator()
                             (in_stack_ffffffffffffff80,iVar2,in_stack_ffffffffffffff70);
          fVar1 = *pfVar5;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_60,lVar6);
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RSI,lVar6,lVar7);
          local_64 = in_XMM0_Da * extraout_XMM0_Da * extraout_XMM0_Da_00 + fVar1;
          (**(code **)(*in_RCX + 0x118))(in_RCX,local_60,lVar7,&local_64);
        }
      }
    }
    else {
      for (local_60 = 0; local_60 < iVar3; local_60 = local_60 + 1) {
        local_64 = 0.0;
        for (lVar6 = 0; lVar6 < (long)this_00; lVar6 = lVar6 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,lVar6,local_60);
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RSI,lVar6,lVar7);
          local_64 = extraout_XMM0_Da_01 * extraout_XMM0_Da_02 + local_64;
        }
        local_68 = in_XMM0_Da * local_64;
        (**(code **)(*in_RCX + 0x118))(in_RCX,local_60,lVar7,&local_68);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}